

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O3

void helper_gvec_sdot_idx_b_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  
  uVar9 = desc * 8 & 0xff;
  uVar6 = uVar9 + 8;
  uVar8 = (ulong)uVar6;
  uVar7 = (ulong)(uVar6 >> 2);
  iVar10 = (int)desc >> 10;
  uVar5 = 4;
  if (uVar7 < 4) {
    uVar5 = uVar7;
  }
  lVar12 = 0;
  do {
    cVar1 = *(char *)((long)vm + lVar12 * 4 + (long)iVar10 * 4);
    cVar2 = *(char *)((long)vm + lVar12 * 4 + (long)iVar10 * 4 + 1);
    cVar3 = *(char *)((long)vm + lVar12 * 4 + (long)iVar10 * 4 + 2);
    cVar4 = *(char *)((long)vm + lVar12 * 4 + (long)iVar10 * 4 + 3);
    do {
      lVar11 = lVar12;
      *(int *)((long)vd + lVar11 * 4) =
           (int)*(char *)((long)vn + lVar11 * 4 + 2) * (int)cVar3 +
           (int)*(char *)((long)vn + lVar11 * 4 + 1) * (int)cVar2 +
           (int)*(char *)((long)vn + lVar11 * 4) * (int)cVar1 + *(int *)((long)vd + lVar11 * 4) +
           (int)*(char *)((long)vn + lVar11 * 4 + 3) * (int)cVar4;
      lVar12 = lVar11 + 1;
    } while (lVar12 < (long)uVar5);
    uVar5 = lVar11 + 5;
  } while (lVar12 < (long)uVar7);
  uVar6 = desc >> 2 & 0xf8;
  if (uVar9 < uVar6) {
    uVar7 = (ulong)(uVar6 + 8);
    uVar5 = uVar8 + 8;
    if (uVar8 + 8 < uVar7) {
      uVar5 = uVar7;
    }
    memset((void *)((long)vd + uVar8),0,(~uVar8 + uVar5 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_sdot_idx_b)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, segend, opr_sz = simd_oprsz(desc), opr_sz_4 = opr_sz / 4;
    intptr_t index = simd_data(desc);
    uint32_t *d = vd;
    int8_t *n = vn;
    int8_t *m_indexed = (int8_t *)vm + index * 4;

    /* Notice the special case of opr_sz == 8, from aa64/aa32 advsimd.
     * Otherwise opr_sz is a multiple of 16.
     */
    segend = MIN(4, opr_sz_4);
    i = 0;
    do {
        int8_t m0 = m_indexed[i * 4 + 0];
        int8_t m1 = m_indexed[i * 4 + 1];
        int8_t m2 = m_indexed[i * 4 + 2];
        int8_t m3 = m_indexed[i * 4 + 3];

        do {
            d[i] += n[i * 4 + 0] * m0
                  + n[i * 4 + 1] * m1
                  + n[i * 4 + 2] * m2
                  + n[i * 4 + 3] * m3;
        } while (++i < segend);
        segend = i + 4;
    } while (i < opr_sz_4);

    clear_tail(d, opr_sz, simd_maxsz(desc));
}